

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralMember::~IfcStructuralMember(IfcStructuralMember *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject +
                   -0x18);
  puVar1 = (undefined8 *)
           (&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)(&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20 + lVar3)
  ;
  plVar2[-0x17] = 0x827038;
  plVar2[0xd] = 0x8270b0;
  plVar2[-6] = 0x827060;
  plVar2[-4] = 0x827088;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x827150;
  puVar1[0x24] = 0x827178;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
  }
  operator_delete(puVar1,0x138);
  return;
}

Assistant:

IfcStructuralMember() : Object("IfcStructuralMember") {}